

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall TempTrackerBase::Dump(TempTrackerBase *this,char16 *traceName)

{
  char16 *traceName_local;
  TempTrackerBase *this_local;
  
  Output::Print(L"%s:        Non temp syms:",traceName);
  BVSparse<Memory::JitArenaAllocator>::Dump(&this->nonTempSyms);
  Output::Print(L"%s: Temp transferred syms:",traceName);
  BVSparse<Memory::JitArenaAllocator>::Dump(&this->tempTransferredSyms);
  if (this->tempTransferDependencies !=
      (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
    Output::Print(L"%s: Temp transfer dependencies:\n",traceName);
    HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Dump
              (this->tempTransferDependencies,2);
  }
  return;
}

Assistant:

void
TempTrackerBase::Dump(char16 const * traceName)
{
    Output::Print(_u("%s:        Non temp syms:"), traceName);
    this->nonTempSyms.Dump();
    Output::Print(_u("%s: Temp transferred syms:"), traceName);
    this->tempTransferredSyms.Dump();
    if (this->tempTransferDependencies != nullptr)
    {
        Output::Print(_u("%s: Temp transfer dependencies:\n"), traceName);
        this->tempTransferDependencies->Dump();
    }
}